

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  float fVar2;
  exception *e;
  allocator<char> local_41;
  string local_40;
  float local_1c;
  char *pcStack_18;
  float num_sum;
  char *file_name;
  
  file_name._4_4_ = 0;
  pcStack_18 = "numbers.txt";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"numbers.txt",&local_41);
  fVar2 = sum(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = fVar2;
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum of all numbers in \'");
  poVar1 = std::operator<<(poVar1,pcStack_18);
  poVar1 = std::operator<<(poVar1,"\' is: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return file_name._4_4_;
}

Assistant:

int main()
{
	auto file_name = "numbers.txt";
	try
	{
		auto num_sum = sum(file_name);
		std::cout << "Sum of all numbers in '" << file_name << "' is: "
			<< num_sum << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}